

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

BinsSelectExpr *
slang::ast::ConditionBinsSelectExpr::fromSyntax
          (BinsSelectConditionExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  RangeListSyntax *pRVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Symbol *args;
  ConditionBinsSelectExpr *pCVar4;
  Type *lvalueType;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined4 extraout_var_00;
  InvalidBinsSelectExpr *pIVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_01;
  long lVar7;
  ulong uVar8;
  SourceRange sourceRange;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  Expression *local_78;
  undefined1 local_70 [64];
  
  this = ((context->scope).ptr)->compilation;
  iVar3 = Expression::bind((int)(syntax->name).ptr,(sockaddr *)context,0x4000000);
  bVar2 = Expression::bad((Expression *)CONCAT44(extraout_var,iVar3));
  if (!bVar2) {
    args = Expression::getSymbolReference((Expression *)CONCAT44(extraout_var,iVar3),true);
    if ((args != (Symbol *)0x0) &&
       ((args->kind == Coverpoint ||
        ((args->kind == CoverageBin && (args->parentScope->thisSym->kind == Coverpoint)))))) {
      pCVar4 = BumpAllocator::emplace<slang::ast::ConditionBinsSelectExpr,slang::ast::Symbol_const&>
                         (&this->super_BumpAllocator,args);
      if (syntax->intersects == (IntersectClauseSyntax *)0x0) {
        return &pCVar4->super_BinsSelectExpr;
      }
      if (args->kind != Coverpoint) {
        args = args->parentScope->thisSym;
      }
      lvalueType = DeclaredType::getType((DeclaredType *)&args[1].originatingSyntax);
      local_70._0_8_ = local_70 + 0x18;
      local_70._8_8_ = 0;
      local_70._16_8_ = 5;
      pRVar1 = (syntax->intersects->ranges).ptr;
      uVar8 = (pRVar1->valueRanges).elements._M_extent._M_extent_value + 1;
      src = extraout_RDX;
      if (1 < uVar8) {
        uVar8 = uVar8 >> 1;
        lVar7 = 0;
        do {
          ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               ((long)&(((pRVar1->valueRanges).elements._M_ptr)->
                                       super_ConstTokenOrSyntax).
                                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               + lVar7));
          local_78 = bindCovergroupExpr((ExpressionSyntax *)*ppSVar5,context,lvalueType,
                                        (bitmask<slang::ast::ASTFlags>)0x0);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
          lVar7 = lVar7 + 0x30;
          uVar8 = uVar8 - 1;
          src = extraout_RDX_00;
        } while (uVar8 != 0);
      }
      iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)local_70,
                         (EVP_PKEY_CTX *)this,src);
      (pCVar4->intersects)._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar3);
      (pCVar4->intersects)._M_extent._M_extent_value = extraout_RDX_01;
      if ((BinsSelectExpr *)local_70._0_8_ == (BinsSelectExpr *)(local_70 + 0x18)) {
        return &pCVar4->super_BinsSelectExpr;
      }
      operator_delete((void *)local_70._0_8_);
      return &pCVar4->super_BinsSelectExpr;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->name).ptr);
    ASTContext::addDiag(context,(DiagCode)0x620007,sourceRange);
  }
  local_70._0_8_ = (BinsSelectExpr *)0x0;
  pIVar6 = BumpAllocator::
           emplace<slang::ast::InvalidBinsSelectExpr,slang::ast::BinsSelectExpr_const*&>
                     (&this->super_BumpAllocator,(BinsSelectExpr **)local_70);
  return &pIVar6->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& ConditionBinsSelectExpr::fromSyntax(const BinsSelectConditionExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& nameExpr = Expression::bind(*syntax.name, context, ASTFlags::AllowCoverpoint);
    if (nameExpr.bad())
        return badExpr(comp, nullptr);

    auto sym = nameExpr.getSymbolReference();
    if (!sym || (sym->kind != SymbolKind::Coverpoint &&
                 (sym->kind != SymbolKind::CoverageBin ||
                  sym->getParentScope()->asSymbol().kind != SymbolKind::Coverpoint))) {
        context.addDiag(diag::InvalidBinsTarget, syntax.name->sourceRange());
        return badExpr(comp, nullptr);
    }

    auto expr = comp.emplace<ConditionBinsSelectExpr>(*sym);

    if (syntax.intersects) {
        const Type* type;
        if (sym->kind == SymbolKind::Coverpoint)
            type = &sym->as<CoverpointSymbol>().declaredType.getType();
        else
            type = &sym->getParentScope()->asSymbol().as<CoverpointSymbol>().declaredType.getType();

        SmallVector<const Expression*> buffer;
        for (auto elem : syntax.intersects->ranges->valueRanges)
            buffer.push_back(&bindCovergroupExpr(*elem, context, type));
        expr->intersects = buffer.copy(comp);
    }

    return *expr;
}